

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void fileToMsg(string *filename,Msg *msg)

{
  undefined8 uVar1;
  string local_38 [8];
  string s;
  Msg *msg_local;
  string *filename_local;
  
  uVar1 = std::__cxx11::string::c_str();
  sprintf(msg->buf,"%s",uVar1);
  std::__cxx11::string::c_str();
  read_all_lines_one_abi_cxx11_((char *)local_38);
  uVar1 = std::__cxx11::string::c_str();
  sprintf(msg->buf2,"%s",uVar1);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void fileToMsg(String filename, Msg &msg){
    sprintf(msg.buf,"%s",filename.c_str());
    String s = read_all_lines_one(filename.c_str());
    sprintf(msg.buf2,"%s",s.c_str());
}